

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

int glfwGetWindowAttrib(GLFWwindow *handle,int attrib)

{
  _GLFWwindow *window;
  int attrib_local;
  GLFWwindow *handle_local;
  
  if (handle != (GLFWwindow *)0x0) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      handle_local._4_4_ = 0;
    }
    else if (attrib == 0x20001) {
      handle_local._4_4_ = _glfwPlatformWindowFocused((_GLFWwindow *)handle);
    }
    else if (attrib == 0x20002) {
      handle_local._4_4_ = _glfwPlatformWindowIconified((_GLFWwindow *)handle);
    }
    else if (attrib == 0x20003) {
      handle_local._4_4_ = *(int *)(handle + 8);
    }
    else if (attrib == 0x20004) {
      handle_local._4_4_ = _glfwPlatformWindowVisible((_GLFWwindow *)handle);
    }
    else if (attrib == 0x20005) {
      handle_local._4_4_ = *(int *)(handle + 0xc);
    }
    else if (attrib == 0x20006) {
      handle_local._4_4_ = *(int *)(handle + 0x10);
    }
    else if (attrib == 0x20007) {
      handle_local._4_4_ = *(int *)(handle + 0x14);
    }
    else if (attrib == 0x20008) {
      handle_local._4_4_ = _glfwPlatformWindowMaximized((_GLFWwindow *)handle);
    }
    else if (attrib == 0x2000a) {
      handle_local._4_4_ = _glfwPlatformFramebufferTransparent((_GLFWwindow *)handle);
    }
    else if (attrib == 0x2000b) {
      handle_local._4_4_ = _glfwPlatformWindowHovered((_GLFWwindow *)handle);
    }
    else if (attrib == 0x22001) {
      handle_local._4_4_ = *(int *)(handle + 0x1f0);
    }
    else if (attrib == 0x22002) {
      handle_local._4_4_ = *(int *)(handle + 0x1f8);
    }
    else if (attrib == 0x22003) {
      handle_local._4_4_ = *(int *)(handle + 0x1fc);
    }
    else if (attrib == 0x22004) {
      handle_local._4_4_ = *(int *)(handle + 0x200);
    }
    else if (attrib == 0x22005) {
      handle_local._4_4_ = *(int *)(handle + 0x214);
    }
    else if (attrib == 0x22006) {
      handle_local._4_4_ = *(int *)(handle + 0x204);
    }
    else if (attrib == 0x22007) {
      handle_local._4_4_ = *(int *)(handle + 0x208);
    }
    else if (attrib == 0x22008) {
      handle_local._4_4_ = *(int *)(handle + 0x210);
    }
    else if (attrib == 0x22009) {
      handle_local._4_4_ = *(int *)(handle + 0x218);
    }
    else if (attrib == 0x2200a) {
      handle_local._4_4_ = *(int *)(handle + 0x20c);
    }
    else if (attrib == 0x2200b) {
      handle_local._4_4_ = *(int *)(handle + 500);
    }
    else {
      _glfwInputError(0x10003,"Invalid window attribute 0x%08X",(ulong)(uint)attrib);
      handle_local._4_4_ = 0;
    }
    return handle_local._4_4_;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/glfw/src/window.c"
                ,0x31d,"int glfwGetWindowAttrib(GLFWwindow *, int)");
}

Assistant:

GLFWAPI int glfwGetWindowAttrib(GLFWwindow* handle, int attrib)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(0);

    switch (attrib)
    {
        case GLFW_FOCUSED:
            return _glfwPlatformWindowFocused(window);
        case GLFW_ICONIFIED:
            return _glfwPlatformWindowIconified(window);
        case GLFW_VISIBLE:
            return _glfwPlatformWindowVisible(window);
        case GLFW_MAXIMIZED:
            return _glfwPlatformWindowMaximized(window);
        case GLFW_HOVERED:
            return _glfwPlatformWindowHovered(window);
        case GLFW_TRANSPARENT_FRAMEBUFFER:
            return _glfwPlatformFramebufferTransparent(window);
        case GLFW_RESIZABLE:
            return window->resizable;
        case GLFW_DECORATED:
            return window->decorated;
        case GLFW_FLOATING:
            return window->floating;
        case GLFW_AUTO_ICONIFY:
            return window->autoIconify;
        case GLFW_CLIENT_API:
            return window->context.client;
        case GLFW_CONTEXT_CREATION_API:
            return window->context.source;
        case GLFW_CONTEXT_VERSION_MAJOR:
            return window->context.major;
        case GLFW_CONTEXT_VERSION_MINOR:
            return window->context.minor;
        case GLFW_CONTEXT_REVISION:
            return window->context.revision;
        case GLFW_CONTEXT_ROBUSTNESS:
            return window->context.robustness;
        case GLFW_OPENGL_FORWARD_COMPAT:
            return window->context.forward;
        case GLFW_OPENGL_DEBUG_CONTEXT:
            return window->context.debug;
        case GLFW_OPENGL_PROFILE:
            return window->context.profile;
        case GLFW_CONTEXT_RELEASE_BEHAVIOR:
            return window->context.release;
        case GLFW_CONTEXT_NO_ERROR:
            return window->context.noerror;
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid window attribute 0x%08X", attrib);
    return 0;
}